

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

void __thiscall
kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper(BufferedOutputStreamWrapper *this)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  bool bVar4;
  
  (this->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__BufferedOutputStreamWrapper_0021b700;
  bVar4 = UnwindDetector::isUnwinding(&this->unwindDetector);
  puVar1 = (this->buffer).ptr;
  if (bVar4) {
    if (this->bufferPos <= puVar1) goto LAB_001ad093;
    (*this->inner->_vptr_OutputStream[2])();
  }
  else {
    if (this->bufferPos <= puVar1) goto LAB_001ad093;
    (*this->inner->_vptr_OutputStream[2])();
  }
  this->bufferPos = (this->buffer).ptr;
LAB_001ad093:
  puVar1 = (this->ownedBuffer).ptr;
  if (puVar1 != (uchar *)0x0) {
    sVar2 = (this->ownedBuffer).size_;
    (this->ownedBuffer).ptr = (uchar *)0x0;
    (this->ownedBuffer).size_ = 0;
    pAVar3 = (this->ownedBuffer).disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,puVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper() noexcept(false) {
  unwindDetector.catchExceptionsIfUnwinding([&]() {
    flush();
  });
}